

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::SolveStrategy::continueAlgo(SolveStrategy *this)

{
  bool bVar1;
  
  if (((this->signal_).super___atomic_base<unsigned_int>._M_i == 0) ||
     (((this->state_).super___atomic_base<unsigned_int>._M_i & 3) == 0)) {
    if ((this->state_).super___atomic_base<unsigned_int>._M_i != 1) {
      return;
    }
    bVar1 = SolveAlgorithm::next(this->algo_);
    if (bVar1) {
      return;
    }
  }
  bVar1 = SolveAlgorithm::more(this->algo_);
  detachAlgo(this,bVar1,0,0);
  return;
}

Assistant:

void continueAlgo() {
		bool detach = true;
		try {
			detach = (signal() && running()) || (state_ == state_run && !algo_->next());
			if (detach) { detach = false; detachAlgo(algo_->more(), 0); }
		}
		catch (...) {
			if (detach) { detachAlgo(algo_->more(), 1); }
			else        { throw; }
		}
	}